

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::FileDescriptorTables::AddFieldByNumber
          (FileDescriptorTables *this,FieldDescriptor *field)

{
  FieldsByNumberSet *common;
  ctrl_t *pcVar1;
  ctrl_t *pcVar2;
  int iVar3;
  Descriptor *pDVar4;
  slot_type pFVar5;
  ulong uVar6;
  uint uVar7;
  ushort uVar8;
  ctrl_t cVar9;
  ctrl_t cVar10;
  ctrl_t cVar11;
  ctrl_t cVar12;
  ctrl_t cVar13;
  ctrl_t cVar14;
  ctrl_t cVar15;
  ctrl_t cVar16;
  ctrl_t cVar17;
  ctrl_t cVar18;
  ctrl_t cVar19;
  ctrl_t cVar20;
  ctrl_t cVar21;
  ctrl_t cVar22;
  ctrl_t cVar23;
  ctrl_t cVar24;
  undefined1 uVar25;
  ushort uVar27;
  uint64_t v;
  bool bVar26;
  ctrl_t *pcVar28;
  slot_type *ppFVar29;
  ctrl_t *pcVar30;
  size_t sVar31;
  reference ppFVar32;
  Nonnull<const_char_*> pcVar33;
  uintptr_t v_2;
  undefined1 *puVar34;
  char *__function;
  undefined1 (*pauVar35) [16];
  anon_union_8_1_a8a14541_for_iterator_2 extraout_RDX;
  long lVar36;
  anon_union_8_1_a8a14541_for_iterator_2 aVar37;
  size_t cap;
  uint uVar38;
  uint64_t v_9;
  Descriptor *in_R9;
  uintptr_t v_6;
  uintptr_t v_28;
  undefined1 *unaff_R12;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  bool bVar42;
  bool bVar43;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar52 [16];
  FindInfo target;
  iterator iVar53;
  iterator iVar54;
  iterator iVar55;
  iterator iVar56;
  __m128i match;
  __m128i match_1;
  ulong local_d8;
  ctrl_t *local_d0;
  ctrl_t local_78;
  ctrl_t cStack_77;
  ctrl_t cStack_76;
  ctrl_t cStack_75;
  iterator local_60;
  iterator local_50;
  const_iterator local_40;
  ctrl_t cVar44;
  ctrl_t cVar49;
  ctrl_t cVar50;
  ctrl_t cVar51;
  
  pDVar4 = field->containing_type_;
  if (pDVar4 != (Descriptor *)0x0) {
    iVar3 = field->number_;
    if ((0 < (long)iVar3) && (iVar3 <= (int)(uint)pDVar4->sequential_field_limit_)) {
      if ((field->field_0x1 & 8) != 0) {
        return false;
      }
      lVar36 = (long)iVar3 + -1;
      if (pDVar4->field_count_ < iVar3) {
        pcVar33 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (lVar36,(long)pDVar4->field_count_,"index < field_count()");
      }
      else {
        pcVar33 = (Nonnull<const_char_*>)0x0;
      }
      if (pcVar33 == (Nonnull<const_char_*>)0x0) {
        return pDVar4->fields_ + (int)lVar36 == field;
      }
      AddFieldByNumber();
      goto LAB_0014fcfe;
    }
  }
  common = &this->fields_by_number_;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::AssertNotDebugCapacity
            (&common->
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            );
  if (1 < (this->fields_by_number_).
          super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          .settings_.
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          size_) {
    uVar41 = ((ulong)field->containing_type_ ^ 0x46ead8) * -0x234dd359734ecb13;
    uVar41 = ((uVar41 >> 0x38 | (uVar41 & 0xff000000000000) >> 0x28 |
               (uVar41 & 0xff0000000000) >> 0x18 | (uVar41 & 0xff00000000) >> 8 |
               (uVar41 & 0xff000000) << 8 | (uVar41 & 0xff0000) << 0x18 | (uVar41 & 0xff00) << 0x28
              | uVar41 << 0x38) ^ (ulong)field->containing_type_) * -0x234dd359734ecb13;
    uVar39 = (uVar41 >> 0x38 | (uVar41 & 0xff000000000000) >> 0x28 |
              (uVar41 & 0xff0000000000) >> 0x18 | (uVar41 & 0xff00000000) >> 8 |
              (uVar41 & 0xff000000) << 8 | (uVar41 & 0xff0000) << 0x18 | (uVar41 & 0xff00) << 0x28 |
             uVar41 << 0x38) ^ (ulong)(uint)field->number_;
    uVar41 = (common->
             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ).settings_.
             super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
             .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
             capacity_;
    if (uVar41 == 1) {
      ppFVar29 = absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ::soo_slot(&common->
                             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           );
      pDVar4 = (*ppFVar29)->containing_type_;
      if ((pDVar4 == field->containing_type_) &&
         (uVar38 = (*ppFVar29)->number_, uVar38 == field->number_)) {
        uVar41 = ((ulong)pDVar4 ^ 0x46ead8) * -0x234dd359734ecb13;
        uVar41 = ((uVar41 >> 0x38 | (uVar41 & 0xff000000000000) >> 0x28 |
                   (uVar41 & 0xff0000000000) >> 0x18 | (uVar41 & 0xff00000000) >> 8 |
                   (uVar41 & 0xff000000) << 8 | (uVar41 & 0xff0000) << 0x18 |
                   (uVar41 & 0xff00) << 0x28 | uVar41 << 0x38) ^ (ulong)pDVar4) *
                 -0x234dd359734ecb13;
        if (uVar39 != ((uVar41 >> 0x38 | (uVar41 & 0xff000000000000) >> 0x28 |
                        (uVar41 & 0xff0000000000) >> 0x18 | (uVar41 & 0xff00000000) >> 8 |
                        (uVar41 & 0xff000000) << 8 | (uVar41 & 0xff0000) << 0x18 |
                        (uVar41 & 0xff00) << 0x28 | uVar41 << 0x38) ^ (ulong)uVar38)) {
LAB_0014f57d:
          __function = 
          "auto absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::FieldDescriptor *>>::AssertHashEqConsistent(google::protobuf::FieldDescriptor *const &)::(anonymous class)::operator()(const ctrl_t *, slot_type *) const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::FieldDescriptor *>]"
          ;
          goto LAB_0014fa20;
        }
      }
    }
    else {
      if (uVar41 == 0) goto LAB_0014fc72;
      if (uVar41 < 0x11) {
        ppFVar29 = absl::lts_20250127::container_internal::
                   raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ::slot_array(&common->
                                 super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                               );
        uVar41 = (this->fields_by_number_).
                 super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 .settings_.
                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                 .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                 value.capacity_;
        pauVar35 = (undefined1 (*) [16])
                   (this->fields_by_number_).
                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   .settings_.
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                   value.heap_or_soo_.heap.control;
        if (uVar41 < 0xf) {
          if (8 < uVar41) goto LAB_0014fcfe;
          uVar41 = *(ulong *)(*pauVar35 + uVar41) & 0x8080808080808080;
          if (uVar41 != 0x8080808080808080) {
            uVar41 = uVar41 ^ 0x8080808080808080;
            do {
              lVar36 = 0;
              if (uVar41 != 0) {
                for (; (uVar41 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
                }
              }
              lVar36 = *(long *)((long)ppFVar29 + ((ulong)((uint)lVar36 & 0xfffffff8) - 8));
              in_R9 = *(Descriptor **)(lVar36 + 0x20);
              if ((in_R9 == field->containing_type_) &&
                 (uVar38 = *(uint *)(lVar36 + 4), uVar38 == field->number_)) {
                uVar40 = ((ulong)in_R9 ^ 0x46ead8) * -0x234dd359734ecb13;
                uVar40 = ((uVar40 >> 0x38 | (uVar40 & 0xff000000000000) >> 0x28 |
                           (uVar40 & 0xff0000000000) >> 0x18 | (uVar40 & 0xff00000000) >> 8 |
                           (uVar40 & 0xff000000) << 8 | (uVar40 & 0xff0000) << 0x18 |
                           (uVar40 & 0xff00) << 0x28 | uVar40 << 0x38) ^ (ulong)in_R9) *
                         -0x234dd359734ecb13;
                if (uVar39 != ((uVar40 >> 0x38 | (uVar40 & 0xff000000000000) >> 0x28 |
                                (uVar40 & 0xff0000000000) >> 0x18 | (uVar40 & 0xff00000000) >> 8 |
                                (uVar40 & 0xff000000) << 8 | (uVar40 & 0xff0000) << 0x18 |
                                (uVar40 & 0xff00) << 0x28 | uVar40 << 0x38) ^ (ulong)uVar38))
                goto LAB_0014f57d;
              }
              uVar41 = uVar41 & uVar41 - 1;
            } while (uVar41 != 0);
          }
        }
        else {
          uVar41 = (this->fields_by_number_).
                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   .settings_.
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                   value.size_;
          if (1 < uVar41) {
            uVar41 = uVar41 >> 1;
            do {
              auVar45 = *pauVar35;
              uVar38 = (uint)(ushort)((ushort)(SUB161(auVar45 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar45 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar45 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar45 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar45 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar45 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar45 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar45 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar45 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar45 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar45 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar45 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar45 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar45 >> 0x6f,0) & 1) << 0xd |
                                      (ushort)(SUB161(auVar45 >> 0x77,0) & 1) << 0xe |
                                     (ushort)(byte)(auVar45[0xf] >> 7) << 0xf);
              if (uVar38 != 0xffff) {
                uVar38 = ~uVar38;
                do {
                  uVar7 = 0;
                  if (uVar38 != 0) {
                    for (; (uVar38 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                    }
                  }
                  if ((char)(*pauVar35)[uVar7] < '\0') goto LAB_0014fc2f;
                  in_R9 = ppFVar29[uVar7]->containing_type_;
                  if ((in_R9 == field->containing_type_) &&
                     (uVar7 = ppFVar29[uVar7]->number_, uVar7 == field->number_)) {
                    uVar40 = ((ulong)in_R9 ^ 0x46ead8) * -0x234dd359734ecb13;
                    uVar40 = ((uVar40 >> 0x38 | (uVar40 & 0xff000000000000) >> 0x28 |
                               (uVar40 & 0xff0000000000) >> 0x18 | (uVar40 & 0xff00000000) >> 8 |
                               (uVar40 & 0xff000000) << 8 | (uVar40 & 0xff0000) << 0x18 |
                               (uVar40 & 0xff00) << 0x28 | uVar40 << 0x38) ^ (ulong)in_R9) *
                             -0x234dd359734ecb13;
                    if (uVar39 != ((uVar40 >> 0x38 | (uVar40 & 0xff000000000000) >> 0x28 |
                                    (uVar40 & 0xff0000000000) >> 0x18 | (uVar40 & 0xff00000000) >> 8
                                    | (uVar40 & 0xff000000) << 8 | (uVar40 & 0xff0000) << 0x18 |
                                    (uVar40 & 0xff00) << 0x28 | uVar40 << 0x38) ^ (ulong)uVar7))
                    goto LAB_0014f57d;
                  }
                  uVar41 = uVar41 - 1;
                  uVar27 = (ushort)(uVar38 - 1) & (ushort)uVar38;
                  uVar38 = CONCAT22((short)(uVar38 - 1 >> 0x10),uVar27);
                } while (uVar27 != 0);
              }
              if (uVar41 == 0) goto LAB_0014f1d9;
              ppFVar29 = ppFVar29 + 0x10;
              puVar34 = *pauVar35;
              pauVar35 = pauVar35 + 1;
            } while (puVar34[0xf] != -1);
            goto LAB_0014fbfc;
          }
        }
      }
    }
  }
LAB_0014f1d9:
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::AssertNotDebugCapacity
            (&common->
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            );
  sVar31 = (common->
           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ).settings_.
           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
           capacity_;
  if (sVar31 == 1) {
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::AssertNotDebugCapacity
              (&common->
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              );
    if ((this->fields_by_number_).
        super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        .settings_.
        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
        .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_
        < 2) {
      sVar31 = (common->
               super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ).settings_.
               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
               .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
               value.capacity_;
      if (sVar31 != 1) {
        if (sVar31 != 0) {
          __assert_fail("(is_soo()) && \"Try enabling sanitizers.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0xe3f,
                        "HashtablezInfoHandle absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::FieldDescriptor *>>::try_sample_soo() [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::FieldDescriptor *>]"
                       );
        }
        goto LAB_0014fc72;
      }
      absl::lts_20250127::container_internal::CommonFields::AssertInSooMode((CommonFields *)common);
      (this->fields_by_number_).
      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      .settings_.
      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
      .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ =
           2;
      aVar37.slot_ = absl::lts_20250127::container_internal::
                     raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ::soo_slot(&common->
                                 super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                               );
      iVar55.field_1.slot_ = aVar37.slot_;
      iVar55.ctrl_ = (ctrl_t *)aVar37;
      puVar34 = absl::lts_20250127::container_internal::kSooControl;
    }
    else {
      ppFVar29 = absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ::soo_slot(&common->
                             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           );
      if (((*ppFVar29)->containing_type_ == field->containing_type_) &&
         ((*ppFVar29)->number_ == field->number_)) {
        aVar37.slot_ = absl::lts_20250127::container_internal::
                       raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ::soo_slot(&common->
                                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                 );
        iVar54.field_1.slot_ = aVar37.slot_;
        iVar54.ctrl_ = absl::lts_20250127::container_internal::kSooControl;
        bVar26 = false;
        goto LAB_0014f662;
      }
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::resize_impl(common,3);
      uVar41 = ((ulong)field->containing_type_ ^ 0x46ead8) * -0x234dd359734ecb13;
      uVar41 = ((uVar41 >> 0x38 | (uVar41 & 0xff000000000000) >> 0x28 |
                 (uVar41 & 0xff0000000000) >> 0x18 | (uVar41 & 0xff00000000) >> 8 |
                 (uVar41 & 0xff000000) << 8 | (uVar41 & 0xff0000) << 0x18 |
                 (uVar41 & 0xff00) << 0x28 | uVar41 << 0x38) ^ (ulong)field->containing_type_) *
               -0x234dd359734ecb13;
      uVar41 = ((uVar41 >> 0x38 | (uVar41 & 0xff000000000000) >> 0x28 |
                 (uVar41 & 0xff0000000000) >> 0x18 | (uVar41 & 0xff00000000) >> 8 |
                 (uVar41 & 0xff000000) << 8 | (uVar41 & 0xff0000) << 0x18 |
                 (uVar41 & 0xff00) << 0x28 | uVar41 << 0x38) ^ (ulong)(uint)field->number_) *
               -0x234dd359734ecb13;
      sVar31 = absl::lts_20250127::container_internal::PrepareInsertAfterSoo
                         (uVar41 >> 0x38 | (uVar41 & 0xff000000000000) >> 0x28 |
                          (uVar41 & 0xff0000000000) >> 0x18 | (uVar41 & 0xff00000000) >> 8 |
                          (uVar41 & 0xff000000) << 8 | (uVar41 & 0xff0000) << 0x18 |
                          (uVar41 & 0xff00) << 0x28 | uVar41 << 0x38,8,(CommonFields *)common);
      iVar55 = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ::iterator_at(&common->
                              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                             ,sVar31);
      puVar34 = iVar55.ctrl_;
    }
    iVar54.field_1.slot_ = iVar55.field_1.slot_;
    iVar54.ctrl_ = puVar34;
    bVar26 = true;
  }
  else {
    if (sVar31 == 0) goto LAB_0014fc72;
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::prefetch_heap_block
              (&common->
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              );
    uVar41 = (common->
             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ).settings_.
             super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
             .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
             capacity_;
    if ((uVar41 + 1 & uVar41) != 0) goto LAB_0014fc4e;
    pcVar30 = (ctrl_t *)(ulong)(uint)field->number_;
    uVar39 = ((ulong)field->containing_type_ ^ 0x46ead8) * -0x234dd359734ecb13;
    uVar39 = ((uVar39 >> 0x38 | (uVar39 & 0xff000000000000) >> 0x28 |
               (uVar39 & 0xff0000000000) >> 0x18 | (uVar39 & 0xff00000000) >> 8 |
               (uVar39 & 0xff000000) << 8 | (uVar39 & 0xff0000) << 0x18 | (uVar39 & 0xff00) << 0x28
              | uVar39 << 0x38) ^ (ulong)field->containing_type_) * -0x234dd359734ecb13;
    uVar39 = ((uVar39 >> 0x38 | (uVar39 & 0xff000000000000) >> 0x28 |
               (uVar39 & 0xff0000000000) >> 0x18 | (uVar39 & 0xff00000000) >> 8 |
               (uVar39 & 0xff000000) << 8 | (uVar39 & 0xff0000) << 0x18 | (uVar39 & 0xff00) << 0x28
              | uVar39 << 0x38) ^ (ulong)pcVar30) * -0x234dd359734ecb13;
    unaff_R12 = (undefined1 *)
                (uVar39 >> 0x38 | (uVar39 & 0xff000000000000) >> 0x28 |
                 (uVar39 & 0xff0000000000) >> 0x18 | (uVar39 & 0xff00000000) >> 8 |
                 (uVar39 & 0xff000000) << 8 | (uVar39 & 0xff0000) << 0x18 |
                 (uVar39 & 0xff00) << 0x28 | uVar39 << 0x38);
    uVar40 = ((ulong)unaff_R12 >> 7 ^
             (ulong)(this->fields_by_number_).
                    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    .settings_.
                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                    .value.heap_or_soo_.heap.control >> 0xc) & uVar41;
    pcVar28 = absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::control(&common->
                         super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       );
    uVar25 = (undefined1)(uVar39 >> 0x38);
    auVar45 = ZEXT216(CONCAT11(uVar25,uVar25) & 0x7f7f);
    auVar45 = pshuflw(auVar45,auVar45,0);
    local_d0 = (ctrl_t *)0x0;
    aVar37 = extraout_RDX;
    do {
      pcVar2 = pcVar28 + uVar40;
      cVar9 = *pcVar2;
      cVar10 = pcVar2[1];
      cVar11 = pcVar2[2];
      cVar12 = pcVar2[3];
      cVar13 = pcVar2[4];
      cVar14 = pcVar2[5];
      cVar15 = pcVar2[6];
      cVar16 = pcVar2[7];
      cVar17 = pcVar2[8];
      cVar18 = pcVar2[9];
      cVar19 = pcVar2[10];
      cVar20 = pcVar2[0xb];
      cVar21 = pcVar2[0xc];
      cVar22 = pcVar2[0xd];
      cVar23 = pcVar2[0xe];
      cVar24 = pcVar2[0xf];
      cVar44 = auVar45[0];
      auVar46[0] = -(cVar44 == cVar9);
      cVar49 = auVar45[1];
      auVar46[1] = -(cVar49 == cVar10);
      cVar50 = auVar45[2];
      auVar46[2] = -(cVar50 == cVar11);
      cVar51 = auVar45[3];
      auVar46[3] = -(cVar51 == cVar12);
      auVar46[4] = -(cVar44 == cVar13);
      auVar46[5] = -(cVar49 == cVar14);
      auVar46[6] = -(cVar50 == cVar15);
      auVar46[7] = -(cVar51 == cVar16);
      auVar46[8] = -(cVar44 == cVar17);
      auVar46[9] = -(cVar49 == cVar18);
      auVar46[10] = -(cVar50 == cVar19);
      auVar46[0xb] = -(cVar51 == cVar20);
      auVar46[0xc] = -(cVar44 == cVar21);
      auVar46[0xd] = -(cVar49 == cVar22);
      auVar46[0xe] = -(cVar50 == cVar23);
      auVar46[0xf] = -(cVar51 == cVar24);
      uVar27 = (ushort)(SUB161(auVar46 >> 7,0) & 1) | (ushort)(SUB161(auVar46 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar46 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar46 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar46 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar46 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar46 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar46 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar46 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar46 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar46 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar46 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar46 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar46 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar46 >> 0x77,0) & 1) << 0xe | (ushort)(auVar46[0xf] >> 7) << 0xf;
      uVar38 = (uint)uVar27;
      while (uVar27 != 0) {
        uVar7 = 0;
        if (uVar38 != 0) {
          for (; (uVar38 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
          }
        }
        ppFVar29 = absl::lts_20250127::container_internal::
                   raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ::slot_array(&common->
                                 super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                               );
        uVar39 = uVar7 + uVar40 & uVar41;
        if ((ppFVar29[uVar39]->containing_type_ == field->containing_type_) &&
           (ppFVar29[uVar39]->number_ == field->number_)) {
          iVar54 = absl::lts_20250127::container_internal::
                   raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ::iterator_at(&common->
                                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                 ,uVar39);
          bVar26 = false;
          goto LAB_0014f662;
        }
        uVar27 = (ushort)(uVar38 - 1) & (ushort)uVar38;
        uVar38 = CONCAT22((short)(uVar38 - 1 >> 0x10),uVar27);
      }
      auVar52[0] = -(cVar9 == kEmpty);
      auVar52[1] = -(cVar10 == kEmpty);
      auVar52[2] = -(cVar11 == kEmpty);
      auVar52[3] = -(cVar12 == kEmpty);
      auVar52[4] = -(cVar13 == kEmpty);
      auVar52[5] = -(cVar14 == kEmpty);
      auVar52[6] = -(cVar15 == kEmpty);
      auVar52[7] = -(cVar16 == kEmpty);
      auVar52[8] = -(cVar17 == kEmpty);
      auVar52[9] = -(cVar18 == kEmpty);
      auVar52[10] = -(cVar19 == kEmpty);
      auVar52[0xb] = -(cVar20 == kEmpty);
      auVar52[0xc] = -(cVar21 == kEmpty);
      auVar52[0xd] = -(cVar22 == kEmpty);
      auVar52[0xe] = -(cVar23 == kEmpty);
      auVar52[0xf] = -(cVar24 == kEmpty);
      uVar27 = (ushort)(SUB161(auVar52 >> 7,0) & 1) | (ushort)(SUB161(auVar52 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar52 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar52 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar52 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar52 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar52 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar52 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar52 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar52 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar52 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar52 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar52 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar52 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar52 >> 0x77,0) & 1) << 0xe | (ushort)(auVar52[0xf] >> 7) << 0xf;
      pcVar2 = (ctrl_t *)
               (common->
               super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ).settings_.
               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
               .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
               value.capacity_;
      if (uVar27 == 0) {
        if (pcVar2 == (ctrl_t *)0x0) goto LAB_0014fc72;
        pcVar1 = local_d0 + 0x10;
        iVar53.field_1.slot_ = aVar37.slot_;
        iVar53.ctrl_ = pcVar1;
        if (pcVar2 < pcVar1) {
          __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0xf7d,
                        "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::FieldDescriptor *>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::FieldDescriptor *>, K = google::protobuf::FieldDescriptor *]"
                       );
        }
        uVar40 = (ulong)(local_d0 + uVar40 + 0x10) & uVar41;
        local_d0 = pcVar1;
      }
      else {
        if (pcVar2 == (ctrl_t *)0x0) goto LAB_0014fc72;
        pcVar30 = absl::lts_20250127::container_internal::
                  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ::control(&common->
                             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           );
        bVar26 = absl::lts_20250127::container_internal::ShouldInsertBackwardsForDebug
                           ((size_t)pcVar2,(size_t)unaff_R12,pcVar30);
        if (bVar26) {
          uVar8 = 0xf;
          if (uVar27 != 0) {
            for (; uVar27 >> uVar8 == 0; uVar8 = uVar8 - 1) {
            }
          }
          uVar38 = (ushort)((uVar8 ^ 0xfff0) + 0x11) - 1;
        }
        else {
          uVar38 = 0;
          if (uVar27 != 0) {
            for (; (uVar27 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
            }
          }
        }
        target.probe_length =
             (size_t)absl::lts_20250127::container_internal::
                     raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FieldDescriptor_const*>,google::protobuf::(anonymous_namespace)::ParentNumberHash,google::protobuf::(anonymous_namespace)::ParentNumberEq,std::allocator<google::protobuf::FieldDescriptor_const*>>
                     ::GetPolicyFunctions()::value;
        target.offset = (size_t)local_d0;
        sVar31 = absl::lts_20250127::container_internal::PrepareInsertNonSoo
                           ((container_internal *)common,(CommonFields *)unaff_R12,
                            uVar38 + uVar40 & uVar41,target,(PolicyFunctions *)in_R9);
        iVar53 = absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ::iterator_at(&common->
                                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                               ,sVar31);
        pcVar30 = iVar53.ctrl_;
      }
      aVar37 = iVar53.field_1;
      iVar54.field_1.slot_ = aVar37.slot_;
      iVar54.ctrl_ = pcVar30;
      bVar26 = true;
    } while (uVar27 == 0);
  }
LAB_0014f662:
  if (!bVar26) {
    return bVar26;
  }
  sVar31 = (this->fields_by_number_).
           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           .settings_.
           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
           capacity_;
  (this->fields_by_number_).
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0xffffffffffffff9c;
  *iVar54.field_1.slot_ = field;
  local_60 = iVar54;
  absl::lts_20250127::container_internal::CommonFields::set_capacity((CommonFields *)common,sVar31);
  ppFVar32 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ::iterator::operator*(&local_60);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::AssertNotDebugCapacity
            (&common->
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            );
  aVar37.slot_ = (slot_type *)0xdcb22ca68cb134ed;
  if (1 < (this->fields_by_number_).
          super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          .settings_.
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          size_) {
    pDVar4 = (*ppFVar32)->containing_type_;
    uVar41 = ((ulong)pDVar4 ^ 0x46ead8) * -0x234dd359734ecb13;
    uVar41 = ((uVar41 >> 0x38 | (uVar41 & 0xff000000000000) >> 0x28 |
               (uVar41 & 0xff0000000000) >> 0x18 | (uVar41 & 0xff00000000) >> 8 |
               (uVar41 & 0xff000000) << 8 | (uVar41 & 0xff0000) << 0x18 | (uVar41 & 0xff00) << 0x28
              | uVar41 << 0x38) ^ (ulong)pDVar4) * -0x234dd359734ecb13;
    uVar39 = (uVar41 >> 0x38 | (uVar41 & 0xff000000000000) >> 0x28 |
              (uVar41 & 0xff0000000000) >> 0x18 | (uVar41 & 0xff00000000) >> 8 |
              (uVar41 & 0xff000000) << 8 | (uVar41 & 0xff0000) << 0x18 | (uVar41 & 0xff00) << 0x28 |
             uVar41 << 0x38) ^ (ulong)(uint)(*ppFVar32)->number_;
    uVar41 = (common->
             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ).settings_.
             super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
             .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
             capacity_;
    if (uVar41 == 1) {
      ppFVar29 = absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ::soo_slot(&common->
                             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           );
      pDVar4 = (*ppFVar29)->containing_type_;
      if ((pDVar4 == (*ppFVar32)->containing_type_) &&
         (uVar38 = (*ppFVar29)->number_, uVar38 == (*ppFVar32)->number_)) {
        uVar41 = ((ulong)pDVar4 ^ 0x46ead8) * -0x234dd359734ecb13;
        uVar41 = ((uVar41 >> 0x38 | (uVar41 & 0xff000000000000) >> 0x28 |
                   (uVar41 & 0xff0000000000) >> 0x18 | (uVar41 & 0xff00000000) >> 8 |
                   (uVar41 & 0xff000000) << 8 | (uVar41 & 0xff0000) << 0x18 |
                   (uVar41 & 0xff00) << 0x28 | uVar41 << 0x38) ^ (ulong)pDVar4) *
                 -0x234dd359734ecb13;
        if (uVar39 != ((uVar41 >> 0x38 | (uVar41 & 0xff000000000000) >> 0x28 |
                        (uVar41 & 0xff0000000000) >> 0x18 | (uVar41 & 0xff00000000) >> 8 |
                        (uVar41 & 0xff000000) << 8 | (uVar41 & 0xff0000) << 0x18 |
                        (uVar41 & 0xff00) << 0x28 | uVar41 << 0x38) ^ (ulong)uVar38)) {
LAB_0014fa0b:
          __function = 
          "auto absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::FieldDescriptor *>>::AssertHashEqConsistent(const google::protobuf::FieldDescriptor *const &)::(anonymous class)::operator()(const ctrl_t *, slot_type *) const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::FieldDescriptor *>]"
          ;
LAB_0014fa20:
          __assert_fail("(!is_key_equal || is_hash_equal) && \"eq(k1, k2) must imply that hash(k1) == hash(k2). \" \"hash/eq functors are inconsistent.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0xfbf,__function);
        }
      }
    }
    else {
      if (uVar41 == 0) goto LAB_0014fc72;
      if (uVar41 < 0x11) {
        ppFVar29 = absl::lts_20250127::container_internal::
                   raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ::slot_array(&common->
                                 super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                               );
        uVar41 = (this->fields_by_number_).
                 super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 .settings_.
                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                 .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                 value.capacity_;
        pauVar35 = (undefined1 (*) [16])
                   (this->fields_by_number_).
                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   .settings_.
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                   value.heap_or_soo_.heap.control;
        if (uVar41 < 0xf) {
          if (8 < uVar41) {
LAB_0014fcfe:
            __assert_fail("(cap <= GroupPortableImpl::kWidth && \"unexpectedly large small capacity\") && \"Try enabling sanitizers.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x78b,
                          "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::FieldDescriptor *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                         );
          }
          uVar41 = *(ulong *)(*pauVar35 + uVar41) & 0x8080808080808080;
          if (uVar41 != 0x8080808080808080) {
            uVar41 = uVar41 ^ 0x8080808080808080;
            do {
              lVar36 = 0;
              if (uVar41 != 0) {
                for (; (uVar41 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
                }
              }
              lVar36 = *(long *)((long)ppFVar29 + ((ulong)((uint)lVar36 & 0xfffffff8) - 8));
              pDVar4 = *(Descriptor **)(lVar36 + 0x20);
              if ((pDVar4 == (*ppFVar32)->containing_type_) &&
                 (uVar38 = *(uint *)(lVar36 + 4), uVar38 == (*ppFVar32)->number_)) {
                uVar40 = ((ulong)pDVar4 ^ 0x46ead8) * -0x234dd359734ecb13;
                uVar40 = ((uVar40 >> 0x38 | (uVar40 & 0xff000000000000) >> 0x28 |
                           (uVar40 & 0xff0000000000) >> 0x18 | (uVar40 & 0xff00000000) >> 8 |
                           (uVar40 & 0xff000000) << 8 | (uVar40 & 0xff0000) << 0x18 |
                           (uVar40 & 0xff00) << 0x28 | uVar40 << 0x38) ^ (ulong)pDVar4) *
                         -0x234dd359734ecb13;
                if (uVar39 != ((uVar40 >> 0x38 | (uVar40 & 0xff000000000000) >> 0x28 |
                                (uVar40 & 0xff0000000000) >> 0x18 | (uVar40 & 0xff00000000) >> 8 |
                                (uVar40 & 0xff000000) << 8 | (uVar40 & 0xff0000) << 0x18 |
                                (uVar40 & 0xff00) << 0x28 | uVar40 << 0x38) ^ (ulong)uVar38))
                goto LAB_0014fa0b;
              }
              uVar41 = uVar41 & uVar41 - 1;
            } while (uVar41 != 0);
          }
        }
        else {
          uVar41 = (this->fields_by_number_).
                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   .settings_.
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                   value.size_;
          if (1 < uVar41) {
            uVar41 = uVar41 >> 1;
            do {
              auVar45 = *pauVar35;
              uVar38 = (uint)(ushort)((ushort)(SUB161(auVar45 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar45 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar45 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar45 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar45 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar45 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar45 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar45 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar45 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar45 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar45 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar45 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar45 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar45 >> 0x6f,0) & 1) << 0xd |
                                      (ushort)(SUB161(auVar45 >> 0x77,0) & 1) << 0xe |
                                     (ushort)(byte)(auVar45[0xf] >> 7) << 0xf);
              if (uVar38 != 0xffff) {
                uVar38 = ~uVar38;
                do {
                  uVar7 = 0;
                  if (uVar38 != 0) {
                    for (; (uVar38 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                    }
                  }
                  if ((char)(*pauVar35)[uVar7] < '\0') {
LAB_0014fc2f:
                    __assert_fail("(IsFull(ctrl[i]) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                                  ,0x79d,
                                  "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::FieldDescriptor *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                                 );
                  }
                  pDVar4 = ppFVar29[uVar7]->containing_type_;
                  if ((pDVar4 == (*ppFVar32)->containing_type_) &&
                     (uVar7 = ppFVar29[uVar7]->number_, uVar7 == (*ppFVar32)->number_)) {
                    uVar40 = ((ulong)pDVar4 ^ 0x46ead8) * -0x234dd359734ecb13;
                    uVar40 = ((uVar40 >> 0x38 | (uVar40 & 0xff000000000000) >> 0x28 |
                               (uVar40 & 0xff0000000000) >> 0x18 | (uVar40 & 0xff00000000) >> 8 |
                               (uVar40 & 0xff000000) << 8 | (uVar40 & 0xff0000) << 0x18 |
                               (uVar40 & 0xff00) << 0x28 | uVar40 << 0x38) ^ (ulong)pDVar4) *
                             -0x234dd359734ecb13;
                    if (uVar39 != ((uVar40 >> 0x38 | (uVar40 & 0xff000000000000) >> 0x28 |
                                    (uVar40 & 0xff0000000000) >> 0x18 | (uVar40 & 0xff00000000) >> 8
                                    | (uVar40 & 0xff000000) << 8 | (uVar40 & 0xff0000) << 0x18 |
                                    (uVar40 & 0xff00) << 0x28 | uVar40 << 0x38) ^ (ulong)uVar7))
                    goto LAB_0014fa0b;
                  }
                  uVar41 = uVar41 - 1;
                  uVar27 = (ushort)(uVar38 - 1) & (ushort)uVar38;
                  uVar38 = CONCAT22((short)(uVar38 - 1 >> 0x10),uVar27);
                } while (uVar27 != 0);
              }
              if (uVar41 == 0) goto LAB_0014f6cb;
              ppFVar29 = ppFVar29 + 0x10;
              puVar34 = *pauVar35;
              pauVar35 = pauVar35 + 1;
            } while (puVar34[0xf] != -1);
LAB_0014fbfc:
            __assert_fail("((remaining == 0 || *(ctrl - 1) != ctrl_t::kSentinel) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x7a5,
                          "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::FieldDescriptor *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                         );
          }
        }
      }
    }
  }
LAB_0014f6cb:
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::AssertNotDebugCapacity
            (&common->
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            );
  sVar31 = (common->
           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ).settings_.
           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
           capacity_;
  if (sVar31 != 1) {
    if (sVar31 != 0) {
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::prefetch_heap_block
                (&common->
                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                );
      uVar41 = (common->
               super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ).settings_.
               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
               .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
               value.capacity_;
      if (uVar41 == 1) {
        __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xe2a,
                      "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::FieldDescriptor *>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::FieldDescriptor *>, K = const google::protobuf::FieldDescriptor *]"
                     );
      }
      if (uVar41 != 0) {
        if ((uVar41 + 1 & uVar41) != 0) {
LAB_0014fc4e:
          __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x14c,
                        "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]"
                       );
        }
        pDVar4 = (*ppFVar32)->containing_type_;
        uVar39 = ((ulong)pDVar4 ^ 0x46ead8) * -0x234dd359734ecb13;
        uVar39 = ((uVar39 >> 0x38 | (uVar39 & 0xff000000000000) >> 0x28 |
                   (uVar39 & 0xff0000000000) >> 0x18 | (uVar39 & 0xff00000000) >> 8 |
                   (uVar39 & 0xff000000) << 8 | (uVar39 & 0xff0000) << 0x18 |
                   (uVar39 & 0xff00) << 0x28 | uVar39 << 0x38) ^ (ulong)pDVar4) *
                 -0x234dd359734ecb13;
        uVar39 = ((uVar39 >> 0x38 | (uVar39 & 0xff000000000000) >> 0x28 |
                   (uVar39 & 0xff0000000000) >> 0x18 | (uVar39 & 0xff00000000) >> 8 |
                   (uVar39 & 0xff000000) << 8 | (uVar39 & 0xff0000) << 0x18 |
                   (uVar39 & 0xff00) << 0x28 | uVar39 << 0x38) ^ (ulong)(uint)(*ppFVar32)->number_)
                 * -0x234dd359734ecb13;
        local_d8 = ((uVar39 >> 0x38 | (uVar39 & 0xff000000000000) >> 0x28 |
                     (uVar39 & 0xff0000000000) >> 0x18 | (uVar39 & 0xff00000000) >> 8 |
                     (uVar39 & 0xff000000) << 8 | (uVar39 & 0xff0000) << 0x18 |
                     (uVar39 & 0xff00) << 0x28 | uVar39 << 0x38) >> 7 ^
                   (ulong)(this->fields_by_number_).
                          super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          .settings_.
                          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                          .
                          super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                          .value.heap_or_soo_.heap.control >> 0xc) & uVar41;
        pcVar28 = absl::lts_20250127::container_internal::
                  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ::control(&common->
                             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           );
        uVar25 = (undefined1)(uVar39 >> 0x38);
        auVar45 = ZEXT216(CONCAT11(uVar25,uVar25) & 0x7f7f);
        auVar45 = pshuflw(auVar45,auVar45,0);
        uVar39 = 0;
        do {
          pcVar30 = pcVar28 + local_d8;
          cVar9 = *pcVar30;
          cVar10 = pcVar30[1];
          cVar11 = pcVar30[2];
          cVar12 = pcVar30[3];
          cVar13 = pcVar30[4];
          cVar14 = pcVar30[5];
          cVar15 = pcVar30[6];
          cVar16 = pcVar30[7];
          cVar17 = pcVar30[8];
          cVar18 = pcVar30[9];
          cVar19 = pcVar30[10];
          cVar20 = pcVar30[0xb];
          cVar21 = pcVar30[0xc];
          cVar22 = pcVar30[0xd];
          cVar23 = pcVar30[0xe];
          cVar24 = pcVar30[0xf];
          local_78 = auVar45[0];
          cStack_77 = auVar45[1];
          cStack_76 = auVar45[2];
          cStack_75 = auVar45[3];
          auVar47[0] = -(local_78 == cVar9);
          auVar47[1] = -(cStack_77 == cVar10);
          auVar47[2] = -(cStack_76 == cVar11);
          auVar47[3] = -(cStack_75 == cVar12);
          auVar47[4] = -(local_78 == cVar13);
          auVar47[5] = -(cStack_77 == cVar14);
          auVar47[6] = -(cStack_76 == cVar15);
          auVar47[7] = -(cStack_75 == cVar16);
          auVar47[8] = -(local_78 == cVar17);
          auVar47[9] = -(cStack_77 == cVar18);
          auVar47[10] = -(cStack_76 == cVar19);
          auVar47[0xb] = -(cStack_75 == cVar20);
          auVar47[0xc] = -(local_78 == cVar21);
          auVar47[0xd] = -(cStack_77 == cVar22);
          auVar47[0xe] = -(cStack_76 == cVar23);
          auVar47[0xf] = -(cStack_75 == cVar24);
          uVar27 = (ushort)(SUB161(auVar47 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar47 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar47 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar47 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar47 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar47 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar47 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar47 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar47 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar47 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar47 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar47 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar47 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar47 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar47 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar47[0xf] >> 7) << 0xf;
          uVar38 = (uint)uVar27;
          while (uVar27 != 0) {
            uVar7 = 0;
            if (uVar38 != 0) {
              for (; (uVar38 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
              }
            }
            ppFVar29 = absl::lts_20250127::container_internal::
                       raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ::slot_array(&common->
                                     super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                   );
            uVar40 = uVar7 + local_d8 & uVar41;
            pFVar5 = ppFVar29[uVar40];
            iVar56.field_1.slot_ = aVar37.slot_;
            iVar56.ctrl_ = (ctrl_t *)pFVar5;
            bVar42 = pFVar5->containing_type_ == (*ppFVar32)->containing_type_;
            bVar43 = pFVar5->number_ == (*ppFVar32)->number_;
            if (bVar43 && bVar42) {
              iVar56 = absl::lts_20250127::container_internal::
                       raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ::iterator_at(&common->
                                      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                     ,uVar40);
              unaff_R12 = iVar56.ctrl_;
            }
            aVar37 = iVar56.field_1;
            if (bVar43 && bVar42) break;
            uVar27 = (ushort)(uVar38 - 1) & (ushort)uVar38;
            uVar38 = CONCAT22((short)(uVar38 - 1 >> 0x10),uVar27);
          }
          if (uVar27 != 0) {
LAB_0014f867:
            bVar42 = false;
            uVar40 = uVar39;
          }
          else {
            auVar48[0] = -(cVar9 == kEmpty);
            auVar48[1] = -(cVar10 == kEmpty);
            auVar48[2] = -(cVar11 == kEmpty);
            auVar48[3] = -(cVar12 == kEmpty);
            auVar48[4] = -(cVar13 == kEmpty);
            auVar48[5] = -(cVar14 == kEmpty);
            auVar48[6] = -(cVar15 == kEmpty);
            auVar48[7] = -(cVar16 == kEmpty);
            auVar48[8] = -(cVar17 == kEmpty);
            auVar48[9] = -(cVar18 == kEmpty);
            auVar48[10] = -(cVar19 == kEmpty);
            auVar48[0xb] = -(cVar20 == kEmpty);
            auVar48[0xc] = -(cVar21 == kEmpty);
            auVar48[0xd] = -(cVar22 == kEmpty);
            auVar48[0xe] = -(cVar23 == kEmpty);
            auVar48[0xf] = -(cVar24 == kEmpty);
            if ((((((((((((((((auVar48 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar48 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar48 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar48 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar48 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar48 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar48 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar48 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar48 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar48 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar48 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar48 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar48 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar48 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar48 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                cVar24 == kEmpty) {
              absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::AssertNotDebugCapacity
                        (&common->
                          super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        );
              unaff_R12 = (undefined1 *)0x0;
              goto LAB_0014f867;
            }
            uVar6 = (common->
                    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ).settings_.
                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                    .value.capacity_;
            if (uVar6 == 0) goto LAB_0014fc72;
            uVar40 = uVar39 + 0x10;
            if (uVar6 < uVar40) {
              __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0xe37,
                            "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::FieldDescriptor *>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::FieldDescriptor *>, K = const google::protobuf::FieldDescriptor *]"
                           );
            }
            local_d8 = local_d8 + uVar39 + 0x10 & uVar41;
            bVar42 = true;
          }
          uVar39 = uVar40;
        } while (bVar42);
        goto LAB_0014fa64;
      }
    }
LAB_0014fc72:
    __assert_fail("cap >= kDefaultCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb75,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::FieldDescriptor *>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::FieldDescriptor *>]"
                 );
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::AssertNotDebugCapacity
            (&common->
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            );
  if (1 < (this->fields_by_number_).
          super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          .settings_.
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          size_) {
    ppFVar29 = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ::soo_slot(&common->
                           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         );
    if (((*ppFVar29)->containing_type_ == (*ppFVar32)->containing_type_) &&
       ((*ppFVar29)->number_ == (*ppFVar32)->number_)) {
      aVar37.slot_ = absl::lts_20250127::container_internal::
                     raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ::soo_slot(&common->
                                 super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                               );
      unaff_R12 = absl::lts_20250127::container_internal::kSooControl;
      goto LAB_0014fa64;
    }
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::AssertNotDebugCapacity
            (&common->
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            );
  unaff_R12 = (undefined1 *)0x0;
LAB_0014fa64:
  local_40.inner_.ctrl_ = unaff_R12;
  local_40.inner_.field_1 = aVar37;
  local_50 = iVar54;
  bVar42 = absl::lts_20250127::container_internal::operator==(&local_40,(const_iterator *)&local_50)
  ;
  if (bVar42) {
    return bVar26;
  }
  __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xfe2,
                "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::FieldDescriptor *>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::FieldDescriptor *>, Args = <google::protobuf::FieldDescriptor *const &>]"
               );
}

Assistant:

bool FileDescriptorTables::AddFieldByNumber(FieldDescriptor* field) {
  // Skip fields that are at the start of the sequence.
  if (field->containing_type() != nullptr && field->number() >= 1 &&
      field->number() <= field->containing_type()->sequential_field_limit_) {
    if (field->is_extension()) {
      // Conflicts with the field that already exists in the sequential range.
      return false;
    }
    // Only return true if the field at that index matches. Otherwise it
    // conflicts with the existing field in the sequential range.
    return field->containing_type()->field(field->number() - 1) == field;
  }

  return fields_by_number_.insert(field).second;
}